

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Block * __thiscall
wasm::I64ToI32Lowering::makeSmallShrU
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index leftHigh,Index shift,
          Binary *shiftMask,Binary *widthLessShift)

{
  Builder *pBVar1;
  Expression *pEVar2;
  Binary *pBVar3;
  Binary *this_00;
  Expression *pEVar4;
  Binary *pBVar5;
  LocalSet *any;
  Block *pBVar6;
  
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar2 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  *(Index *)(pEVar2 + 1) = leftHigh;
  (pEVar2->type).id = 2;
  pBVar3 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar3->op = AndInt32;
  pBVar3->left = (Expression *)shiftMask;
  pBVar3->right = pEVar2;
  Binary::finalize(pBVar3);
  this_00 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = ShlInt32;
  this_00->left = (Expression *)pBVar3;
  this_00->right = (Expression *)widthLessShift;
  Binary::finalize(this_00);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar2 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  *(Index *)(pEVar2 + 1) = leftLow;
  (pEVar2->type).id = 2;
  pEVar4 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  *(Index *)(pEVar4 + 1) = shift;
  (pEVar4->type).id = 2;
  pBVar3 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar3->op = ShrUInt32;
  pBVar3->left = pEVar2;
  pBVar3->right = pEVar4;
  Binary::finalize(pBVar3);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar2 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  *(Index *)(pEVar2 + 1) = leftHigh;
  (pEVar2->type).id = 2;
  pEVar4 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  *(Index *)(pEVar4 + 1) = shift;
  (pEVar4->type).id = 2;
  pBVar5 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar5->op = ShrUInt32;
  pBVar5->left = pEVar2;
  pBVar5->right = pEVar4;
  Binary::finalize(pBVar5);
  any = Builder::makeLocalSet(pBVar1,highBits,(Expression *)pBVar5);
  pBVar5 = (Binary *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x28,8);
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar5->op = OrInt32;
  pBVar5->left = (Expression *)this_00;
  pBVar5->right = (Expression *)pBVar3;
  Binary::finalize(pBVar5);
  pBVar6 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)pBVar5);
  return pBVar6;
}

Assistant:

Block* makeSmallShrU(Index highBits,
                       Index leftLow,
                       Index leftHigh,
                       Index shift,
                       Binary* shiftMask,
                       Binary* widthLessShift) {
    Binary* shiftedInBits = builder->makeBinary(
      ShlInt32,
      builder->makeBinary(
        AndInt32, shiftMask, builder->makeLocalGet(leftHigh, Type::i32)),
      widthLessShift);
    Binary* shiftLow =
      builder->makeBinary(ShrUInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(shift, Type::i32));
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrUInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(shift, Type::i32))),
      builder->makeBinary(OrInt32, shiftedInBits, shiftLow));
  }